

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_dimensional_inverse_fast_fourier_transform.cc
# Opt level: O0

void __thiscall
sptk::TwoDimensionalInverseFastFourierTransform::TwoDimensionalInverseFastFourierTransform
          (TwoDimensionalInverseFastFourierTransform *this,int num_row,int num_column,int fft_length
          )

{
  bool bVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  *in_RDI = &PTR__TwoDimensionalInverseFastFourierTransform_0012ac98;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(int *)(in_RDI + 2) = in_ECX;
  InverseFastFourierTransform::InverseFastFourierTransform
            ((InverseFastFourierTransform *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
            );
  *(undefined1 *)(in_RDI + 10) = 1;
  if ((((*(int *)(in_RDI + 1) < 1) || (*(int *)(in_RDI + 2) < *(int *)(in_RDI + 1))) ||
      (*(int *)((long)in_RDI + 0xc) < 1)) ||
     ((in_ECX < *(int *)((long)in_RDI + 0xc) ||
      (bVar1 = InverseFastFourierTransform::IsValid((InverseFastFourierTransform *)0x10b7a9), !bVar1
      )))) {
    *(undefined1 *)(in_RDI + 10) = 0;
  }
  return;
}

Assistant:

TwoDimensionalInverseFastFourierTransform::
    TwoDimensionalInverseFastFourierTransform(int num_row, int num_column,
                                              int fft_length)
    : num_row_(num_row),
      num_column_(num_column),
      fft_length_(fft_length),
      inverse_fast_fourier_transform_(fft_length_),
      is_valid_(true) {
  if (num_row_ <= 0 || fft_length_ < num_row_ || num_column_ <= 0 ||
      fft_length < num_column_ || !inverse_fast_fourier_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }
}